

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suite.c
# Opt level: O3

void destroy_test_suite(TestSuite *suiteToDestroy)

{
  UnitTest *pUVar1;
  TestSuite *suiteToDestroy_00;
  int iVar2;
  long lVar3;
  long lVar4;
  
  iVar2 = suiteToDestroy->size;
  if (0 < iVar2) {
    lVar3 = 0x10;
    lVar4 = 0;
    do {
      pUVar1 = suiteToDestroy->tests;
      suiteToDestroy_00 = *(TestSuite **)((long)&pUVar1->type + lVar3);
      if (suiteToDestroy_00 != (TestSuite *)0x0 && *(int *)((long)pUVar1 + lVar3 + -0x10) == 1) {
        *(undefined8 *)((long)&pUVar1->type + lVar3) = 0;
        destroy_test_suite(suiteToDestroy_00);
        iVar2 = suiteToDestroy->size;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x18;
    } while (lVar4 < iVar2);
  }
  if (suiteToDestroy->tests != (UnitTest *)0x0) {
    free(suiteToDestroy->tests);
  }
  free(suiteToDestroy);
  return;
}

Assistant:

void destroy_test_suite(TestSuite *suiteToDestroy) {
    int i;
    for (i = 0; i < suiteToDestroy->size; i++) {
        UnitTest test = suiteToDestroy->tests[i];
        TestSuite* suite = test.Runnable.suite;
        if (test_suite == test.type && suite != NULL) {
           suiteToDestroy->tests[i].Runnable.suite = NULL;
           destroy_test_suite(suite);
        }
    }

    if (suiteToDestroy->tests != NULL)
        free(suiteToDestroy->tests);

    free(suiteToDestroy);
}